

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::BeginElemExpr
          (BinaryReaderInterp *this,Index elem_index,Index expr_index)

{
  initializer_list<wabt::Type> __l;
  Result RVar1;
  size_type sVar2;
  reference this_00;
  ulong uVar3;
  reference func;
  allocator<wabt::Type> local_e9;
  ValueType local_e8;
  iterator local_e0;
  size_type local_d8;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_d0;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_b8;
  value_type local_a0;
  reference local_28;
  ElemDesc *elem;
  Index expr_index_local;
  Index elem_index_local;
  BinaryReaderInterp *this_local;
  
  elem._0_4_ = expr_index;
  elem._4_4_ = elem_index;
  _expr_index_local = this;
  sVar2 = std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>::size
                    (&this->module_->elems);
  if ((ulong)elem_index != sVar2 - 1) {
    __assert_fail("elem_index == module_.elems.size() - 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/binary-reader-interp.cc"
                  ,0x2f6,
                  "virtual Result wabt::interp::(anonymous namespace)::BinaryReaderInterp::BeginElemExpr(Index, Index)"
                 );
  }
  this_00 = std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>::back
                      (&this->module_->elems);
  local_28 = this_00;
  memset(&local_b8,0,0x18);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_b8);
  local_e8 = local_28->type;
  local_e0 = &local_e8;
  local_d8 = 1;
  std::allocator<wabt::Type>::allocator(&local_e9);
  __l._M_len = local_d8;
  __l._M_array = local_e0;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_d0,__l,&local_e9);
  FuncType::FuncType(&local_a0.type,&local_b8,&local_d0);
  memset(&local_a0.locals,0,0x18);
  std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::vector
            (&local_a0.locals);
  local_a0.code_offset = 0xffffffff;
  memset(&local_a0.handlers,0,0x18);
  std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::vector
            (&local_a0.handlers);
  std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>::push_back
            (&this_00->elements,&local_a0);
  FuncDesc::~FuncDesc(&local_a0);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_d0);
  std::allocator<wabt::Type>::~allocator(&local_e9);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_b8);
  uVar3 = (ulong)(Index)elem;
  sVar2 = std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>::size
                    (&local_28->elements);
  if (uVar3 == sVar2 - 1) {
    func = std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>::back
                     (&local_28->elements);
    RVar1 = BeginInitExpr(this,func);
    return (Result)RVar1.enum_;
  }
  __assert_fail("expr_index == elem.elements.size() - 1",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/binary-reader-interp.cc"
                ,0x2fa,
                "virtual Result wabt::interp::(anonymous namespace)::BinaryReaderInterp::BeginElemExpr(Index, Index)"
               );
}

Assistant:

Result BinaryReaderInterp::BeginElemExpr(Index elem_index, Index expr_index) {
  assert(elem_index == module_.elems.size() - 1);
  ElemDesc& elem = module_.elems.back();
  elem.elements.push_back(
      {FuncType{{}, {elem.type}}, {}, Istream::kInvalidOffset, {}});
  assert(expr_index == elem.elements.size() - 1);
  return BeginInitExpr(&elem.elements.back());
}